

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O2

InLineIfTag * __thiscall Qentem::Tags::TagBit::MakeInLineIfTag(TagBit *this)

{
  InLineIfTag *pointer;
  
  pointer = (InLineIfTag *)operator_new(0x30);
  MemoryRecord::AddAllocation(pointer);
  (pointer->SubTags).storage_ = (TagBit *)0x0;
  (pointer->SubTags).index_ = 0;
  (pointer->SubTags).capacity_ = 0;
  pointer->Offset = 0;
  pointer->Length = 0;
  pointer->TrueOffset = 0;
  pointer->TrueLength = 0;
  pointer->FalseOffset = 0;
  pointer->FalseLength = 0;
  pointer->TrueTagsStartID = '\0';
  pointer->FalseTagsStartID = '\0';
  (pointer->Case).storage_ = (QExpression *)0x0;
  (pointer->Case).index_ = 0;
  (pointer->Case).capacity_ = 0;
  (pointer->SubTags).storage_ = (TagBit *)0x0;
  (pointer->SubTags).index_ = 0;
  (pointer->SubTags).capacity_ = 0;
  this->type_ = InLineIf;
  this->storage_ = pointer;
  return pointer;
}

Assistant:

InLineIfTag *MakeInLineIfTag() {
        InLineIfTag *tag = Memory::AllocateInit<InLineIfTag>();

        type_    = TagType::InLineIf;
        storage_ = tag;

        return tag;
    }